

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O3

void __thiscall duckdb::QueryRelation::~QueryRelation(QueryRelation *this)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__QueryRelation_02469380;
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&(this->columns).
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>);
  pcVar1 = (this->alias)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->alias).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->query)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->query).field_2) {
    operator_delete(pcVar1);
  }
  _Var2._M_head_impl =
       (this->select_stmt).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
  }
  (this->select_stmt).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  Relation::~Relation(&this->super_Relation);
  return;
}

Assistant:

QueryRelation::~QueryRelation() {
}